

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# btree.h
# Opt level: O0

void __thiscall
absl::container_internal::
btree_node<absl::container_internal::set_params<std::unique_ptr<SeqEntry,_std::default_delete<SeqEntry>_>,_compare_ptr,_std::allocator<std::unique_ptr<SeqEntry,_std::default_delete<SeqEntry>_>_>,_256,_true>_>
::remove_values(btree_node<absl::container_internal::set_params<std::unique_ptr<SeqEntry,_std::default_delete<SeqEntry>_>,_compare_ptr,_std::allocator<std::unique_ptr<SeqEntry,_std::default_delete<SeqEntry>_>_>,_256,_true>_>
                *this,field_type i,field_type to_erase,allocator_type *alloc)

{
  byte bVar1;
  char cVar2;
  bool bVar3;
  int i_00;
  allocator_type *in_RCX;
  byte in_DL;
  byte in_SIL;
  btree_node<absl::container_internal::set_params<std::unique_ptr<SeqEntry,_std::default_delete<SeqEntry>_>,_compare_ptr,_std::allocator<std::unique_ptr<SeqEntry,_std::default_delete<SeqEntry>_>_>,_256,_true>_>
  *in_RDI;
  size_type unaff_retaddr;
  size_type in_stack_00000008;
  btree_node<absl::container_internal::set_params<std::unique_ptr<SeqEntry,_std::default_delete<SeqEntry>_>,_compare_ptr,_std::allocator<std::unique_ptr<SeqEntry,_std::default_delete<SeqEntry>_>_>,_256,_true>_>
  *in_stack_00000010;
  int j_1;
  int j;
  field_type src_i;
  field_type orig_finish;
  int in_stack_ffffffffffffffcc;
  undefined4 in_stack_ffffffffffffffe0;
  int iVar4;
  undefined2 in_stack_ffffffffffffffe4;
  undefined1 in_stack_ffffffffffffffe6;
  undefined1 in_stack_ffffffffffffffe7;
  undefined6 in_stack_fffffffffffffff0;
  btree_node<absl::container_internal::set_params<std::unique_ptr<SeqEntry,_std::default_delete<SeqEntry>_>,_compare_ptr,_std::allocator<std::unique_ptr<SeqEntry,_std::default_delete<SeqEntry>_>_>,_256,_true>_>
  *src_i_00;
  
  src_i_00 = in_RDI;
  value_destroy_n((btree_node<absl::container_internal::set_params<std::unique_ptr<SeqEntry,_std::default_delete<SeqEntry>_>,_compare_ptr,_std::allocator<std::unique_ptr<SeqEntry,_std::default_delete<SeqEntry>_>_>,_256,_true>_>
                   *)CONCAT17(in_SIL,CONCAT16(in_DL,in_stack_fffffffffffffff0)),
                  (field_type)((ulong)in_RCX >> 0x38),(field_type)((ulong)in_RCX >> 0x30),
                  (allocator_type *)
                  CONCAT17(in_stack_ffffffffffffffe7,
                           CONCAT16(in_stack_ffffffffffffffe6,
                                    CONCAT24(in_stack_ffffffffffffffe4,in_stack_ffffffffffffffe0))))
  ;
  bVar1 = finish((btree_node<absl::container_internal::set_params<std::unique_ptr<SeqEntry,_std::default_delete<SeqEntry>_>,_compare_ptr,_std::allocator<std::unique_ptr<SeqEntry,_std::default_delete<SeqEntry>_>_>,_256,_true>_>
                  *)0x195e37);
  cVar2 = in_SIL + in_DL;
  transfer_n(in_stack_00000010,in_stack_00000008,unaff_retaddr,(size_type)src_i_00,
             (btree_node<absl::container_internal::set_params<std::unique_ptr<SeqEntry,_std::default_delete<SeqEntry>_>,_compare_ptr,_std::allocator<std::unique_ptr<SeqEntry,_std::default_delete<SeqEntry>_>_>,_256,_true>_>
              *)CONCAT17(in_SIL,CONCAT16(in_DL,in_stack_fffffffffffffff0)),in_RCX);
  bVar3 = is_internal((btree_node<absl::container_internal::set_params<std::unique_ptr<SeqEntry,_std::default_delete<SeqEntry>_>,_compare_ptr,_std::allocator<std::unique_ptr<SeqEntry,_std::default_delete<SeqEntry>_>_>,_256,_true>_>
                       *)0x195e84);
  if (bVar3) {
    for (iVar4 = 0; iVar4 < (int)(uint)in_DL; iVar4 = iVar4 + 1) {
      child(in_RDI,in_stack_ffffffffffffffcc);
      clear_and_delete((btree_node<absl::container_internal::set_params<std::unique_ptr<SeqEntry,_std::default_delete<SeqEntry>_>,_compare_ptr,_std::allocator<std::unique_ptr<SeqEntry,_std::default_delete<SeqEntry>_>_>,_256,_true>_>
                        *)alloc,_j);
    }
    i_00 = (uint)in_SIL + (uint)in_DL;
    while (i_00 = i_00 + 1, i_00 <= (int)(uint)bVar1) {
      in_stack_ffffffffffffffcc = i_00 - (uint)in_DL;
      child(in_RDI,in_stack_ffffffffffffffcc);
      set_child((btree_node<absl::container_internal::set_params<std::unique_ptr<SeqEntry,_std::default_delete<SeqEntry>_>,_compare_ptr,_std::allocator<std::unique_ptr<SeqEntry,_std::default_delete<SeqEntry>_>_>,_256,_true>_>
                 *)CONCAT17(bVar1,CONCAT16(cVar2,CONCAT24(in_stack_ffffffffffffffe4,iVar4))),i_00,
                in_RDI);
      clear_child(in_RDI,in_stack_ffffffffffffffcc);
    }
  }
  set_finish(in_RDI,(field_type)((uint)in_stack_ffffffffffffffcc >> 0x18));
  return;
}

Assistant:

inline void btree_node<P>::remove_values(const field_type i,
                                         const field_type to_erase,
                                         allocator_type *alloc) {
  // Transfer values after the removed range into their new places.
  value_destroy_n(i, to_erase, alloc);
  const field_type orig_finish = finish();
  const field_type src_i = i + to_erase;
  transfer_n(orig_finish - src_i, i, src_i, this, alloc);

  if (is_internal()) {
    // Delete all children between begin and end.
    for (int j = 0; j < to_erase; ++j) {
      clear_and_delete(child(i + j + 1), alloc);
    }
    // Rotate children after end into new positions.
    for (int j = i + to_erase + 1; j <= orig_finish; ++j) {
      set_child(j - to_erase, child(j));
      clear_child(j);
    }
  }
  set_finish(orig_finish - to_erase);
}